

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  byte *__src;
  byte bVar1;
  int a_00;
  stbi_uc *psVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  stbi_uc *psVar7;
  char *pcVar8;
  void *__ptr;
  size_t __n;
  byte *pbVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  stbi__uint32 sVar17;
  uint uVar18;
  ushort *puVar19;
  uint uVar20;
  size_t __n_00;
  stbi_uc *psVar21;
  byte bVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  char cVar26;
  int iVar27;
  ulong uVar28;
  uint uVar29;
  ushort *src;
  long in_FS_OFFSET;
  bool bVar30;
  byte local_d5;
  
  bVar30 = depth == 0x10;
  iVar4 = x * out_n << bVar30;
  a_00 = a->s->img_n;
  uVar6 = (ulong)(uint)(a_00 << bVar30);
  if (a_00 + 1 != out_n && a_00 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehedirm6244[P]sysfex/./lib/stb_image.h"
                  ,0x1266,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  psVar7 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar30,0);
  a->out = psVar7;
  if (psVar7 == (stbi_uc *)0x0) {
    *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
    return 0;
  }
  iVar5 = stbi__mad3sizes_valid(a_00,x,depth,7);
  if (iVar5 != 0) {
    uVar16 = a_00 * x;
    uVar15 = uVar16 * depth + 7 >> 3;
    if ((-1 < (int)y) &&
       (((y == 0 || (uVar15 <= (uint)(0x7fffffff / (ulong)y))) &&
        (uVar15 * y <= (uVar15 ^ 0x7fffffff))))) {
      if (raw_len < (uVar15 + 1) * y) {
        pcVar8 = "not enough pixels";
      }
      else {
        __ptr = malloc((ulong)(uVar15 * 2));
        if (__ptr != (void *)0x0) {
          if (y != 0) {
            sVar17 = x;
            if (depth < 8) {
              uVar6 = 1;
              sVar17 = uVar15;
            }
            iVar5 = (int)uVar6;
            uVar18 = sVar17 * iVar5;
            __n_00 = (size_t)iVar5;
            __n = (size_t)(int)uVar18;
            psVar7 = raw + __n_00 + 1;
            local_d5 = 1;
            uVar29 = 0;
            uVar28 = 0;
            do {
              uVar12 = 0;
              if ((uVar28 & 1) != 0) {
                uVar12 = (ulong)uVar15;
              }
              bVar14 = *raw;
              if (4 < (ulong)bVar14) {
                *(char **)(in_FS_OFFSET + -0x20) = "invalid filter";
                free(__ptr);
                return 0;
              }
              if (uVar28 == 0) {
                bVar14 = ""[bVar14];
              }
              src = (ushort *)(uVar12 + (long)__ptr);
              psVar2 = a->out;
              __src = raw + 1;
              if (bVar14 < 6) {
                uVar12 = (ulong)((local_d5 & 1) * uVar15);
                pbVar9 = (byte *)((long)__ptr + uVar12);
                switch(bVar14) {
                case 0:
                  memcpy(src,__src,__n);
                  break;
                case 1:
                  memcpy(src,__src,__n_00);
                  if (iVar5 < (int)uVar18) {
                    lVar11 = 0;
                    do {
                      *(byte *)((long)src + lVar11 + __n_00) =
                           *(byte *)((long)src + lVar11) + psVar7[lVar11];
                      lVar11 = lVar11 + 1;
                    } while ((__n_00 - __n) + lVar11 != 0);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar18) {
                    uVar12 = 0;
                    do {
                      *(byte *)((long)src + uVar12) = pbVar9[uVar12] + raw[uVar12 + 1];
                      uVar12 = uVar12 + 1;
                    } while (uVar18 != uVar12);
                  }
                  break;
                case 3:
                  if (0 < iVar5) {
                    uVar10 = 0;
                    do {
                      *(byte *)((long)src + uVar10) = (pbVar9[uVar10] >> 1) + raw[uVar10 + 1];
                      uVar10 = uVar10 + 1;
                    } while (uVar6 != uVar10);
                  }
                  if (iVar5 < (int)uVar18) {
                    pbVar9 = (byte *)((long)__ptr + uVar12 + __n_00);
                    sVar13 = __n;
                    psVar21 = psVar7;
                    puVar19 = src;
                    do {
                      *(stbi_uc *)((long)puVar19 + __n_00) =
                           (char)((uint)(byte)*puVar19 + (uint)*pbVar9 >> 1) + *psVar21;
                      puVar19 = (ushort *)((long)puVar19 + 1);
                      psVar21 = psVar21 + 1;
                      pbVar9 = pbVar9 + 1;
                      sVar13 = sVar13 - 1;
                    } while (__n_00 != sVar13);
                  }
                  break;
                case 4:
                  if (0 < iVar5) {
                    uVar12 = 0;
                    do {
                      *(byte *)((long)src + uVar12) = pbVar9[uVar12] + raw[uVar12 + 1];
                      uVar12 = uVar12 + 1;
                    } while (uVar6 != uVar12);
                  }
                  sVar13 = __n;
                  psVar21 = psVar7;
                  puVar19 = src;
                  if (iVar5 < (int)uVar18) {
                    do {
                      bVar14 = (byte)*puVar19;
                      bVar22 = pbVar9[__n_00];
                      bVar1 = *pbVar9;
                      uVar23 = (uint)bVar22;
                      uVar20 = (uint)bVar14;
                      iVar27 = (((uint)bVar1 + (uint)bVar1 * 2) - uVar23) - uVar20;
                      uVar24 = (uint)bVar22;
                      uVar3 = uVar24;
                      if (uVar20 < uVar23) {
                        uVar3 = (uint)bVar14;
                      }
                      if (uVar20 >= uVar23 && uVar20 != uVar24) {
                        uVar24 = (uint)bVar14;
                      }
                      uVar20 = (uint)bVar1;
                      if ((int)uVar24 <= iVar27) {
                        uVar20 = uVar3;
                      }
                      cVar26 = (char)uVar20;
                      if (iVar27 <= (int)uVar3) {
                        cVar26 = (char)uVar24;
                      }
                      *(stbi_uc *)((long)puVar19 + __n_00) = cVar26 + *psVar21;
                      puVar19 = (ushort *)((long)puVar19 + 1);
                      pbVar9 = pbVar9 + 1;
                      psVar21 = psVar21 + 1;
                      sVar13 = sVar13 - 1;
                    } while (__n_00 != sVar13);
                  }
                  break;
                case 5:
                  memcpy(src,__src,__n_00);
                  if (iVar5 < (int)uVar18) {
                    lVar11 = 0;
                    do {
                      *(byte *)((long)src + lVar11 + __n_00) =
                           (*(byte *)((long)src + lVar11) >> 1) + psVar7[lVar11];
                      lVar11 = lVar11 + 1;
                    } while ((__n_00 - __n) + lVar11 != 0);
                  }
                }
              }
              uVar12 = (ulong)uVar29;
              psVar21 = psVar2 + (uint)(iVar4 * (int)uVar28);
              if (depth < 8) {
                bVar14 = 1;
                if (color == 0) {
                  bVar14 = ""[depth];
                }
                if (depth == 4) {
                  if (uVar16 != 0) {
                    uVar25 = 0;
                    uVar10 = 0;
                    do {
                      if ((uVar25 & 1) == 0) {
                        uVar10 = (ulong)(byte)*src;
                        src = (ushort *)((long)src + 1);
                      }
                      psVar2[uVar25 + uVar12] = (char)(uVar10 >> 4) * bVar14;
                      uVar10 = (ulong)(byte)((char)uVar10 << 4);
                      uVar25 = uVar25 + 1;
                    } while (uVar16 != (uint)uVar25);
                  }
                }
                else if (depth == 2) {
                  if (uVar16 != 0) {
                    uVar25 = 0;
                    uVar10 = 0;
                    do {
                      if ((uVar25 & 3) == 0) {
                        uVar10 = (ulong)(byte)*src;
                        src = (ushort *)((long)src + 1);
                      }
                      psVar2[uVar25 + uVar12] = (char)(uVar10 >> 6) * bVar14;
                      uVar10 = (ulong)(byte)((char)uVar10 << 2);
                      uVar25 = uVar25 + 1;
                    } while (uVar16 != (uint)uVar25);
                  }
                }
                else {
                  if (depth != 1) {
                    __assert_fail("depth == 1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/mehedirm6244[P]sysfex/./lib/stb_image.h"
                                  ,0x12ca,
                                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                                 );
                  }
                  if (uVar16 != 0) {
                    uVar10 = 0;
                    bVar22 = 0;
                    do {
                      if ((uVar10 & 7) == 0) {
                        bVar22 = (byte)*src;
                        src = (ushort *)((long)src + 1);
                      }
                      psVar2[uVar10 + uVar12] = (char)bVar22 >> 7 & bVar14;
                      bVar22 = bVar22 * '\x02';
                      uVar10 = uVar10 + 1;
                    } while (uVar16 != (uint)uVar10);
                  }
                }
                if (a_00 != out_n) {
                  stbi__create_png_alpha_expand8(psVar21,psVar21,x,a_00);
                }
              }
              else if (depth == 8) {
                if (a_00 == out_n) {
                  memcpy(psVar21,src,(ulong)uVar16);
                }
                else {
                  stbi__create_png_alpha_expand8(psVar21,(stbi_uc *)src,x,a_00);
                }
              }
              else if (depth == 0x10) {
                if (a_00 == out_n) {
                  if (uVar16 != 0) {
                    lVar11 = 0;
                    do {
                      *(ushort *)(psVar2 + lVar11 * 2 + uVar12) =
                           src[lVar11] << 8 | src[lVar11] >> 8;
                      lVar11 = lVar11 + 1;
                    } while (uVar16 != (uint)lVar11);
                  }
                }
                else {
                  if (a_00 + 1 != out_n) {
                    __assert_fail("img_n+1 == out_n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/mehedirm6244[P]sysfex/./lib/stb_image.h"
                                  ,0x12e3,
                                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                                 );
                  }
                  if (a_00 == 1) {
                    if (x != 0) {
                      lVar11 = 0;
                      do {
                        *(ushort *)(psVar2 + lVar11 * 4 + uVar12) =
                             src[lVar11] << 8 | src[lVar11] >> 8;
                        (psVar2 + lVar11 * 4 + uVar12 + 2)[0] = 0xff;
                        (psVar2 + lVar11 * 4 + uVar12 + 2)[1] = 0xff;
                        lVar11 = lVar11 + 1;
                      } while (x != (stbi__uint32)lVar11);
                    }
                  }
                  else {
                    if (a_00 != 3) {
                      __assert_fail("img_n == 3",
                                    "/workspace/llm4binary/github/license_c_cmakelists/mehedirm6244[P]sysfex/./lib/stb_image.h"
                                    ,0x12ea,
                                    "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                                   );
                    }
                    if (x != 0) {
                      lVar11 = 0;
                      do {
                        *(ushort *)(psVar2 + lVar11 * 8 + uVar12) = *src << 8 | *src >> 8;
                        *(ushort *)(psVar2 + lVar11 * 8 + uVar12 + 2) = src[1] << 8 | src[1] >> 8;
                        *(ushort *)(psVar2 + lVar11 * 8 + uVar12 + 4) = src[2] << 8 | src[2] >> 8;
                        (psVar2 + lVar11 * 8 + uVar12 + 6)[0] = 0xff;
                        (psVar2 + lVar11 * 8 + uVar12 + 6)[1] = 0xff;
                        src = src + 3;
                        lVar11 = lVar11 + 1;
                      } while (x != (stbi__uint32)lVar11);
                    }
                  }
                }
              }
              raw = __src + __n;
              uVar28 = uVar28 + 1;
              psVar7 = psVar7 + __n + 1;
              local_d5 = local_d5 + 1;
              uVar29 = uVar29 + iVar4;
            } while (uVar28 != y);
          }
          free(__ptr);
          return 1;
        }
        pcVar8 = "outofmem";
      }
      goto LAB_0011bd20;
    }
  }
  pcVar8 = "too large";
LAB_0011bd20:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar8;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16 ? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   stbi_uc *filter_buf;
   int all_ok = 1;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   // note: error exits here don't need to clean up a->out individually,
   // stbi__do_png always does on error.
   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   if (!stbi__mad2sizes_valid(img_width_bytes, y, img_width_bytes)) return stbi__err("too large", "Corrupt PNG");
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   // Allocate two scan lines worth of filter workspace buffer.
   filter_buf = (stbi_uc *) stbi__malloc_mad2(img_width_bytes, 2, 0);
   if (!filter_buf) return stbi__err("outofmem", "Out of memory");

   // Filtering for low-bit-depth images
   if (depth < 8) {
      filter_bytes = 1;
      width = img_width_bytes;
   }

   for (j=0; j < y; ++j) {
      // cur/prior filter buffers alternate
      stbi_uc *cur = filter_buf + (j & 1)*img_width_bytes;
      stbi_uc *prior = filter_buf + (~j & 1)*img_width_bytes;
      stbi_uc *dest = a->out + stride*j;
      int nk = width * filter_bytes;
      int filter = *raw++;

      // check filter type
      if (filter > 4) {
         all_ok = stbi__err("invalid filter","Corrupt PNG");
         break;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // perform actual filtering
      switch (filter) {
      case STBI__F_none:
         memcpy(cur, raw, nk);
         break;
      case STBI__F_sub:
         memcpy(cur, raw, filter_bytes);
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]);
         break;
      case STBI__F_up:
         for (k = 0; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + prior[k]);
         break;
      case STBI__F_avg:
         for (k = 0; k < filter_bytes; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1));
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1));
         break;
      case STBI__F_paeth:
         for (k = 0; k < filter_bytes; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + prior[k]); // prior[k] == stbi__paeth(0,prior[k],0)
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes], prior[k], prior[k-filter_bytes]));
         break;
      case STBI__F_avg_first:
         memcpy(cur, raw, filter_bytes);
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1));
         break;
      }

      raw += nk;

      // expand decoded bits in cur to dest, also adding an extra alpha channel if desired
      if (depth < 8) {
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range
         stbi_uc *in = cur;
         stbi_uc *out = dest;
         stbi_uc inb = 0;
         stbi__uint32 nsmp = x*img_n;

         // expand bits to bytes first
         if (depth == 4) {
            for (i=0; i < nsmp; ++i) {
               if ((i & 1) == 0) inb = *in++;
               *out++ = scale * (inb >> 4);
               inb <<= 4;
            }
         } else if (depth == 2) {
            for (i=0; i < nsmp; ++i) {
               if ((i & 3) == 0) inb = *in++;
               *out++ = scale * (inb >> 6);
               inb <<= 2;
            }
         } else {
            STBI_ASSERT(depth == 1);
            for (i=0; i < nsmp; ++i) {
               if ((i & 7) == 0) inb = *in++;
               *out++ = scale * (inb >> 7);
               inb <<= 1;
            }
         }

         // insert alpha=255 values if desired
         if (img_n != out_n)
            stbi__create_png_alpha_expand8(dest, dest, x, img_n);
      } else if (depth == 8) {
         if (img_n == out_n)
            memcpy(dest, cur, x*img_n);
         else
            stbi__create_png_alpha_expand8(dest, cur, x, img_n);
      } else if (depth == 16) {
         // convert the image data from big-endian to platform-native
         stbi__uint16 *dest16 = (stbi__uint16*)dest;
         stbi__uint32 nsmp = x*img_n;

         if (img_n == out_n) {
            for (i = 0; i < nsmp; ++i, ++dest16, cur += 2)
               *dest16 = (cur[0] << 8) | cur[1];
         } else {
            STBI_ASSERT(img_n+1 == out_n);
            if (img_n == 1) {
               for (i = 0; i < x; ++i, dest16 += 2, cur += 2) {
                  dest16[0] = (cur[0] << 8) | cur[1];
                  dest16[1] = 0xffff;
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (i = 0; i < x; ++i, dest16 += 4, cur += 6) {
                  dest16[0] = (cur[0] << 8) | cur[1];
                  dest16[1] = (cur[2] << 8) | cur[3];
                  dest16[2] = (cur[4] << 8) | cur[5];
                  dest16[3] = 0xffff;
               }
            }
         }
      }
   }

   STBI_FREE(filter_buf);
   if (!all_ok) return 0;

   return 1;
}